

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O1

void __thiscall
ExtraData::parseDECIMAL
          (ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val,int pos)

{
  ostream *poVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                DECIMAL:            ",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 wReserved:         ",0x24);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"MUST be set to zero and MUST be ignored. ",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 scale:             ",0x24);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Order of magnitude of the decimal number. ",0x2a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "MUST be the power of 10 by which to divide the 96-bit integer represented by Hi32 * 2^64 + Lo64. "
             ,0x61);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"The value MUST be in the range of 0 to 28, inclusive. ",0x36);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 sign:              ",0x24);
  if ((val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[(long)pos + 3] == 0) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffset_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"The decimal contains a positive value. ",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if ((val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[(long)pos + 3] == 0x80) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffset_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"The decimal contains a negative value. ",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"MUST equalMUST equal to 0 or 0x80.",0x22);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 Hi32:              ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,val);
  Utils::print_vec_from_to(&local_48,pos + 4,pos + 8);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"MUST be the high 32 bits of the 96-bit integer ",0x2f);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"that is scaled and signed to represent the final DECIMAL value. ",0x40);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 Lo64:              ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,val);
  Utils::print_vec_from_to(&local_60,pos + 8,pos + 0x10);
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"MUST be the low 64 bits of the 96-bit integer",0x2d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"that is scaled and signed to represent the final DECIMAL value.",0x3f);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void ExtraData::parseDECIMAL(std::vector<unsigned int> val, int pos) {
    cout << "                DECIMAL:            " << endl;
    cout << "                 wReserved:         " << val[pos] << " " << val[pos+1] <<
         Utils::defaultOffsetDocInfo << "MUST be set to zero and MUST be ignored. " << endl;
    cout << "                 scale:             " << dec << val[pos+2] <<
         Utils::defaultOffsetDocInfo << "Order of magnitude of the decimal number. " << endl <<
         Utils::defaultOffsetDocInfo << "MUST be the power of 10 by which to divide the 96-bit integer represented by Hi32 * 2^64 + Lo64. " << endl <<
         Utils::defaultOffsetDocInfo << "The value MUST be in the range of 0 to 28, inclusive. " << endl;
    cout << "                 sign:              ";
    if(val[pos+3] == 0)
        cout << Utils::defaultOffset << "The decimal contains a positive value. " << endl;
    if(val[pos+3] == 0x80)
        cout << Utils::defaultOffset << "The decimal contains a negative value. " << endl;
    cout << Utils::defaultOffsetDocInfo << "MUST equalMUST equal to 0 or 0x80." << endl;
    cout << "                 Hi32:              "; Utils::print_vec_from_to(val, pos+4, pos+8);
    cout << Utils::defaultOffsetDocInfo << "MUST be the high 32 bits of the 96-bit integer " << endl <<
         Utils::defaultOffsetDocInfo << "that is scaled and signed to represent the final DECIMAL value. " << endl;
    cout << "                 Lo64:              "; Utils::print_vec_from_to(val, pos+8, pos+16);
    cout << Utils::defaultOffsetDocInfo << "MUST be the low 64 bits of the 96-bit integer" << endl <<
         Utils::defaultOffsetDocInfo << "that is scaled and signed to represent the final DECIMAL value." << endl;
}